

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cParallelShaderCompileTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::CompilationCompletionNonParallelTest::iterate(CompilationCompletionNonParallelTest *this)

{
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  char *pcVar4;
  qpTestResult testResult;
  TestContext *this_00;
  GLint completionStatus;
  int fLengths [1];
  int vLengths [1];
  char *fSources [1];
  char *vSources [1];
  Program program;
  Shader fragmentShader;
  Shader vertexShader;
  int local_13c [3];
  char *local_130;
  char *local_128;
  Program local_120;
  Shader local_e0;
  Shader local_78;
  Functions *gl;
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     "GL_ARB_parallel_shader_compile");
  if (bVar1) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    gl = (Functions *)CONCAT44(extraout_var,iVar2);
    (*gl->maxShaderCompilerThreadsARB)(0);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"maxShaderCompilerThreadsARB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xd6);
    glu::Program::Program(&local_120,gl);
    glu::Shader::Shader(&local_78,gl,SHADERTYPE_VERTEX);
    glu::Shader::Shader(&local_e0,gl,SHADERTYPE_FRAGMENT);
    local_128 = 
    "#version 450\n\nin vec3 vertex;\n\nint main() {\n    gl_Position = vec4(vertex, 1);\n}\n";
    local_13c[2] = 0x51;
    glu::Shader::setSources(&local_78,1,&local_128,local_13c + 2);
    local_130 = 
    "#version 450\n\nout ver4 fragColor;\n\nint main() {\n    fragColor = vec4(1, 1, 1, 1);\n}\n";
    local_13c[1] = 0x54;
    glu::Shader::setSources(&local_e0,1,&local_130,local_13c + 1);
    (*gl->compileShader)(local_78.m_shader);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"compileShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xe6);
    (*gl->compileShader)(local_e0.m_shader);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"compileShader",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xe8);
    (*gl->getShaderiv)(local_e0.m_shader,0x91b1,local_13c);
    GVar3 = (*gl->getError)();
    glu::checkError(GVar3,"getShaderiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                    ,0xeb);
    if (local_13c[0] == 0) {
      pcVar4 = "Failed reading completion status for non parallel shader compiling";
    }
    else {
      glu::Program::attachShader(&local_120,local_78.m_shader);
      glu::Program::attachShader(&local_120,local_e0.m_shader);
      (*gl->linkProgram)(local_120.m_program);
      (*gl->getProgramiv)(local_120.m_program,0x91b1,local_13c);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"getProgramiv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cParallelShaderCompileTests.cpp"
                      ,0xf8);
      if (local_13c[0] != 0) {
        glu::Shader::~Shader(&local_e0);
        glu::Shader::~Shader(&local_78);
        glu::Program::~Program(&local_120);
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        pcVar4 = "Pass";
        testResult = QP_TEST_RESULT_PASS;
        goto LAB_00a75748;
      }
      pcVar4 = "Failed reading completion status for non parallel program linking";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               pcVar4);
    glu::Shader::~Shader(&local_e0);
    glu::Shader::~Shader(&local_78);
    glu::Program::~Program(&local_120);
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    pcVar4 = "Not supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
LAB_00a75748:
    tcu::TestContext::setTestResult(this_00,testResult,pcVar4);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CompilationCompletionNonParallelTest::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_parallel_shader_compile"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		return STOP;
	}

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLint completionStatus;

	gl.maxShaderCompilerThreadsARB(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "maxShaderCompilerThreadsARB");

	{
		Program program(gl);
		Shader  vertexShader(gl, SHADERTYPE_VERTEX);
		Shader  fragmentShader(gl, SHADERTYPE_FRAGMENT);

		const char* vSources[] = { vShader };
		const int   vLengths[] = { int(strlen(vShader)) };
		vertexShader.setSources(1, vSources, vLengths);

		const char* fSources[] = { fShader };
		const int   fLengths[] = { int(strlen(fShader)) };
		fragmentShader.setSources(1, fSources, fLengths);

		gl.compileShader(vertexShader.getShader());
		GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");
		gl.compileShader(fragmentShader.getShader());
		GLU_EXPECT_NO_ERROR(gl.getError(), "compileShader");

		gl.getShaderiv(fragmentShader.getShader(), GL_COMPLETION_STATUS_ARB, &completionStatus);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getShaderiv");
		if (!completionStatus)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
									"Failed reading completion status for non parallel shader compiling");
			return STOP;
		}

		program.attachShader(vertexShader.getShader());
		program.attachShader(fragmentShader.getShader());
		gl.linkProgram(program.getProgram());

		gl.getProgramiv(program.getProgram(), GL_COMPLETION_STATUS_ARB, &completionStatus);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramiv");
		if (!completionStatus)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL,
									"Failed reading completion status for non parallel program linking");
			return STOP;
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}